

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapecube.cpp
# Opt level: O1

void pzshape::TPZShapeCube::TransformDerivativeFromRibToCube
               (int rib,int num,TPZFMatrix<double> *dphi)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  if (0 < num) {
    lVar3 = (long)rib;
    uVar4 = 0;
    do {
      if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar4)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar1 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar4))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      dphi->fElem[lVar2 * uVar4 + 2] =
           (double)(&DAT_01a583b0)[lVar3 * 3] * dphi->fElem[lVar1 * uVar4];
      if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar4))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar1 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar4))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      dphi->fElem[lVar2 * uVar4 + 1] =
           (double)(&DAT_01a583a8)[lVar3 * 3] * dphi->fElem[lVar1 * uVar4];
      if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar4))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar1 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar4))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * uVar4] =
           (double)(&gRibTrans3dCube1d)[lVar3 * 3] * dphi->fElem[lVar1 * uVar4];
      uVar4 = uVar4 + 1;
    } while ((uint)num != uVar4);
  }
  return;
}

Assistant:

void TPZShapeCube::TransformDerivativeFromRibToCube(int rib,int num,TPZFMatrix<REAL> &dphi) {
		for (int j = 0;j<num;j++) {
			dphi(2,j) = gRibTrans3dCube1d[rib][2]*dphi(0,j);
			dphi(1,j) = gRibTrans3dCube1d[rib][1]*dphi(0,j);
			dphi(0,j) = gRibTrans3dCube1d[rib][0]*dphi(0,j);
		}
	}